

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseMessage<google::protobuf::json_internal::ParseProto3Type>
          (anon_unknown_5 *this,JsonLexer *lex,
          Desc<google::protobuf::json_internal::ParseProto3Type> *desc,
          Msg<google::protobuf::json_internal::ParseProto3Type> *msg,bool any_reparse)

{
  uint uVar1;
  JsonLocation *pJVar2;
  undefined4 uVar3;
  Type TVar4;
  iterator iVar5;
  size_t sVar6;
  char *pcVar7;
  uint8_t *puVar8;
  pointer pcVar9;
  int *piVar10;
  undefined1 auVar11 [8];
  bool bVar12;
  char cVar13;
  bool bVar14;
  MessageType MVar15;
  size_t *psVar16;
  string *psVar17;
  Msg<google::protobuf::json_internal::ParseProto3Type> *pMVar18;
  Field pFVar19;
  Msg *pMVar20;
  undefined8 uVar21;
  char *pcVar22;
  undefined8 *puVar23;
  Status *_status;
  int iVar24;
  undefined7 in_register_00000081;
  pointer *ppCVar25;
  MessagePath *pMVar26;
  string_view literal;
  string_view name;
  string_view literal_00;
  string_view literal_01;
  string_view literal_02;
  string_view literal_03;
  string_view literal_04;
  string_view x;
  string_view x_00;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> SVar27;
  string_view sVar28;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  ArrayInputStream in;
  LocationWith<google::protobuf::json_internal::Mark> mark;
  optional<google::protobuf::json_internal::MaybeOwnedString> type_url;
  bool local_1c9;
  undefined1 local_1b0 [8];
  undefined1 auStack_1a8 [88];
  HeapOrSoo local_150;
  undefined4 local_140;
  undefined4 uStack_13c;
  MessagePath *pMStack_138;
  HeapOrSoo local_130;
  char *local_120;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_118;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  _Stack_110;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_e0;
  uint local_bc;
  undefined1 local_b8 [48];
  undefined1 local_88 [48];
  bool local_58;
  ZeroCopyBufferedStream *local_50;
  ZeroCopyInputStream *local_48;
  LogMessageFatal local_40 [16];
  
  psVar16 = (size_t *)
            ((ulong)(desc->raw_).field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  sVar28._M_str = (char *)desc;
  sVar28._M_len = *psVar16;
  pcVar22 = (char *)CONCAT71(in_register_00000081,any_reparse);
  MVar15 = ClassifyMessage((json_internal *)psVar16[1],sVar28);
  iVar24 = (int)(char *)CONCAT71(in_register_00000081,any_reparse);
  local_120 = (char *)CONCAT44(local_120._4_4_,iVar24);
  if (iVar24 != 0) {
switchD_002c4be7_caseD_3:
    JsonLexer::Expect((JsonLexer *)this,lex,1,"{");
    if (*(long *)this != 1) {
      return (Status)(uintptr_t)this;
    }
    iVar24 = (lex->options_).recursion_depth;
    if (iVar24 == 0) {
      JsonLocation::Invalid
                ((JsonLocation *)this,&lex->json_loc_,0x22,"JSON content was too deeply nested");
    }
    else {
      (lex->options_).recursion_depth = iVar24 + -1;
      *(undefined8 *)this = 1;
    }
    if (*(long *)this != 1) {
      return (Status)(uintptr_t)this;
    }
    literal._M_str = "}";
    literal._M_len = 1;
    bVar12 = JsonLexer::Peek(lex,literal);
    if (bVar12) {
      piVar10 = &(lex->options_).recursion_depth;
      *piVar10 = *piVar10 + 1;
LAB_002c4c4e:
      *(undefined8 *)this = 1;
      return (Status)(uintptr_t)this;
    }
    local_130.heap.slot_array = (MaybeInitializedPtr)&lex->json_loc_;
    local_1c9 = true;
LAB_002c4c70:
    if (local_1c9 == false) {
      pcVar22 = "expected \',\'";
      goto LAB_002c51c1;
    }
    JsonLexer::SkipToToken((JsonLexer *)this);
    if (*(long *)this != 1) {
      return (Status)(uintptr_t)this;
    }
    absl::lts_20240722::
    StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)local_1b0);
    cVar13 = ZeroCopyBufferedStream::PeekChar(&lex->stream_);
    if ((cVar13 == '\"') ||
       (cVar13 = ZeroCopyBufferedStream::PeekChar(&lex->stream_), cVar13 == '\'')) {
      JsonLexer::ParseUtf8
                ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  *)&local_118.status_,lex);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)local_1b0,
                  (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_118.status_);
LAB_002c4cdb:
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_118.status_);
      *(undefined1 (*) [8])this = local_1b0;
      if (((ulong)local_1b0 & 1) == 0) {
        LOCK();
        *(int *)local_1b0 = *(int *)local_1b0 + 1;
        UNLOCK();
      }
      if (*(long *)this != 1) {
        bVar12 = false;
        goto LAB_002c5167;
      }
      JsonLexer::Expect((JsonLexer *)this,lex,1);
      if (*(long *)this == 1) {
        if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )local_1b0 ==
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )0x1) {
          if ((char)local_120 == '\0') {
LAB_002c4df9:
            psVar17 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)auStack_1a8);
            local_b8._8_8_ = (psVar17->_M_dataplus)._M_p;
            local_b8._0_8_ = psVar17->_M_string_length;
            if ((((ZeroCopyInputStream *)local_b8._0_8_ == (ZeroCopyInputStream *)0x0) ||
                (*(char *)&((ZeroCopyBufferedStream *)local_b8._8_8_)->stream_ != '[')) ||
               (((undefined1 *)
                ((long)&((ZeroCopyBufferedStream *)(local_b8._8_8_ + -0x50))->
                        outstanding_buffer_borrows_ + 3))[local_b8._0_8_] != ']')) {
              name._M_str = (char *)local_b8._8_8_;
              name._M_len = local_b8._0_8_;
              pMVar18 = (Msg<google::protobuf::json_internal::ParseProto3Type> *)
                        ResolverPool::Message::FindField(desc,name);
              bVar12 = pMVar18 != (Msg<google::protobuf::json_internal::ParseProto3Type> *)0x0;
            }
            else {
              bVar12 = false;
              pMVar18 = (Msg<google::protobuf::json_internal::ParseProto3Type> *)local_1b0;
            }
            if (bVar12) {
              pMVar26 = lex->path_;
              local_48 = (ZeroCopyInputStream *)local_b8._0_8_;
              local_50 = (ZeroCopyBufferedStream *)local_b8._8_8_;
              local_bc = *(uint *)((pMVar18->stream_).impl_.buffer_end_ + 0x48);
              _Stack_110._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName((Field)pMVar18);
              local_118.status_.rep_._0_4_ = local_bc;
              _Stack_110._16_8_ = local_48;
              _Stack_110._24_8_ = local_50;
              uStack_f0 = 0xffffffff;
              iVar5._M_current =
                   (pMVar26->components_).
                   super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (pMVar26->components_).
                  super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                          (&pMVar26->components_,iVar5,(Component *)&local_118.status_);
              }
              else {
                ((iVar5._M_current)->field_name)._M_str = (char *)local_50;
                *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(uStack_ec,0xffffffff);
                ((iVar5._M_current)->type_name)._M_str = (char *)_Stack_110._8_8_;
                ((iVar5._M_current)->field_name)._M_len = (size_t)local_48;
                *(ulong *)iVar5._M_current = CONCAT44(local_118.status_.rep_._4_4_,local_bc);
                ((iVar5._M_current)->type_name)._M_len = _Stack_110._0_8_;
                ppCVar25 = &(pMVar26->components_).
                            super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                *ppCVar25 = *ppCVar25 + 1;
              }
              bVar12 = ParseProto3Type::HasParsed
                                 ((Field)pMVar18,msg,(lex->options_).allow_legacy_syntax);
              if ((!bVar12) || (bVar12 = JsonLexer::Peek(lex,kNull), bVar12)) {
                bVar12 = Proto3Type::IsMap((Field)pMVar18);
                if (bVar12) {
                  ParseMap<google::protobuf::json_internal::ParseProto3Type>
                            ((JsonLexer *)this,
                             (Field<google::protobuf::json_internal::ParseProto3Type>)lex,pMVar18);
                }
                else if ((*(int *)((pMVar18->stream_).impl_.buffer_end_ + 0x4c) == 3) &&
                        (((lex->options_).allow_legacy_syntax != true ||
                         (bVar12 = JsonLexer::Peek(lex,kArr), bVar12)))) {
                  ParseArray<google::protobuf::json_internal::ParseProto3Type>
                            ((JsonLexer *)this,
                             (Field<google::protobuf::json_internal::ParseProto3Type>)lex,pMVar18);
                }
                else {
                  ParseSingular<google::protobuf::json_internal::ParseProto3Type>
                            ((JsonLexer *)this,
                             (Field<google::protobuf::json_internal::ParseProto3Type>)lex,pMVar18);
                }
              }
              else {
                local_88._0_8_ = local_b8;
                local_88._8_8_ =
                     absl::lts_20240722::str_format_internal::FormatArgImpl::
                     Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
                absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                          (&local_118,
                           "\'%s\' has already been set (either directly or as part of a oneof)",
                           0x41,local_88);
                JsonLocation::Invalid
                          ((JsonLocation *)this,local_130.heap.slot_array.p,_Stack_110._0_8_,
                           CONCAT44(local_118.status_.rep_._4_4_,local_118.status_.rep_._0_4_));
                if ((void *)CONCAT44(local_118.status_.rep_._4_4_,local_118.status_.rep_._0_4_) !=
                    (void *)((long)&_Stack_110 + 8)) {
                  operator_delete((void *)CONCAT44(local_118.status_.rep_._4_4_,
                                                   local_118.status_.rep_._0_4_),
                                  (ulong)(_Stack_110._8_8_ + 1));
                }
              }
              ppCVar25 = &(pMVar26->components_).
                          super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *ppCVar25 = *ppCVar25 + -1;
            }
            else if ((lex->options_).ignore_unknown_fields == false) {
              local_88._0_8_ = local_b8;
              local_88._8_8_ =
                   absl::lts_20240722::str_format_internal::FormatArgImpl::
                   Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
              absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                        (&local_118,"no such field: \'%s\'",0x13,local_88);
              JsonLocation::Invalid
                        ((JsonLocation *)this,local_130.heap.slot_array.p,_Stack_110._0_8_,
                         CONCAT44(local_118.status_.rep_._4_4_,local_118.status_.rep_._0_4_));
              if ((void *)CONCAT44(local_118.status_.rep_._4_4_,local_118.status_.rep_._0_4_) !=
                  (void *)((long)&_Stack_110 + 8)) {
                operator_delete((void *)CONCAT44(local_118.status_.rep_._4_4_,
                                                 local_118.status_.rep_._0_4_),
                                (ulong)(_Stack_110._8_8_ + 1));
              }
            }
            else {
              JsonLexer::SkipValue((JsonLexer *)this);
            }
          }
          else {
            bVar12 = json_internal::operator==
                               ((MaybeOwnedString *)auStack_1a8,(char (*) [6])"@type");
            if (bVar12) {
              JsonLexer::SkipValue((JsonLexer *)this);
              if (*(long *)this == 1) {
                *(undefined8 *)this = 1;
              }
            }
            else {
              if (MVar15 == kNotWellKnown) goto LAB_002c4df9;
              bVar12 = json_internal::operator==
                                 ((MaybeOwnedString *)auStack_1a8,(char (*) [6])0x3ec933);
              if (bVar12) {
                ParseMessage<google::protobuf::json_internal::ParseProto3Type>
                          (this,lex,desc,msg,false);
              }
              else {
                JsonLocation::Invalid
                          ((JsonLocation *)this,local_130.heap.slot_array.p,0x37,
                           "fields in a well-known-typed Any must be @type or value");
              }
            }
          }
          if (*(long *)this == 1) {
            literal_00._M_str = ",";
            literal_00._M_len = 1;
            local_1c9 = JsonLexer::Peek(lex,literal_00);
            bVar12 = true;
            goto LAB_002c5167;
          }
          goto LAB_002c5161;
        }
        absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_1b0);
        goto LAB_002c5c72;
      }
    }
    else {
      if ((lex->options_).allow_legacy_syntax == true) {
        JsonLexer::ParseBareWord
                  ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    *)&local_118.status_,lex);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)local_1b0,
                    (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&local_118.status_);
        goto LAB_002c4cdb;
      }
      JsonLocation::Invalid((JsonLocation *)this,local_130.heap.slot_array.p,0xc,"expected \'\"\'");
    }
LAB_002c5161:
    bVar12 = false;
LAB_002c5167:
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)local_1b0);
    if (!bVar12) {
      return (Status)(uintptr_t)this;
    }
    literal_01._M_str = "}";
    literal_01._M_len = 1;
    bVar12 = JsonLexer::Peek(lex,literal_01);
    if (bVar12) goto code_r0x002c5197;
    goto LAB_002c4c70;
  }
  if (MVar15 != kValue) {
    if (MVar15 == kStruct) {
      ParseStructValue<google::protobuf::json_internal::ParseProto3Type>(this,lex,desc,msg);
      return (Status)(uintptr_t)this;
    }
    if (MVar15 == kAny) {
      JsonLexer::SkipToToken((JsonLexer *)this);
      if (*(long *)this != 1) {
        return (Status)(uintptr_t)this;
      }
      ZeroCopyBufferedStream::BeginMark((ZeroCopyBufferedStream *)local_b8);
      local_b8._16_4_ = (undefined4)(lex->json_loc_).offset;
      local_b8._20_4_ = *(undefined4 *)((long)&(lex->json_loc_).offset + 4);
      local_b8._24_4_ = (undefined4)(lex->json_loc_).line;
      local_b8._28_4_ = *(undefined4 *)((long)&(lex->json_loc_).line + 4);
      local_b8._32_4_ = (undefined4)(lex->json_loc_).col;
      local_b8._36_4_ = *(undefined4 *)((long)&(lex->json_loc_).col + 4);
      local_b8._40_4_ = *(undefined4 *)&(lex->json_loc_).path;
      local_b8._44_4_ = *(undefined4 *)((long)&(lex->json_loc_).path + 4);
      local_58 = false;
      JsonLexer::Expect((JsonLexer *)this,lex,1,"{");
      if (*(long *)this == 1) {
        pJVar2 = &lex->json_loc_;
        iVar24 = (lex->options_).recursion_depth;
        if (iVar24 == 0) {
          JsonLocation::Invalid
                    ((JsonLocation *)this,pJVar2,0x22,"JSON content was too deeply nested");
        }
        else {
          (lex->options_).recursion_depth = iVar24 + -1;
          *(undefined8 *)this = 1;
        }
        if (*(long *)this == 1) {
          literal_02._M_str = "}";
          literal_02._M_len = 1;
          bVar12 = JsonLexer::Peek(lex,literal_02);
          if (bVar12) {
            piVar10 = &(lex->options_).recursion_depth;
            *piVar10 = *piVar10 + 1;
          }
          else {
            bVar12 = true;
            local_120 = "expected \',\'";
            do {
              if (bVar12 == false) goto LAB_002c54ab;
              JsonLexer::SkipToToken((JsonLexer *)this);
              if (*(long *)this != 1) goto LAB_002c54c3;
              absl::lts_20240722::
              StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)&local_118.status_);
              cVar13 = ZeroCopyBufferedStream::PeekChar(&lex->stream_);
              if ((cVar13 == '\"') ||
                 (cVar13 = ZeroCopyBufferedStream::PeekChar(&lex->stream_), cVar13 == '\'')) {
                JsonLexer::ParseUtf8
                          ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)local_1b0,lex);
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&local_118.status_,
                            (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)local_1b0);
LAB_002c5304:
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 *)local_1b0);
                piVar10 = (int *)CONCAT44(local_118.status_.rep_._4_4_,local_118.status_.rep_._0_4_)
                ;
                *(int **)this = piVar10;
                if ((local_118.status_.rep_._0_4_ & 1) == 0) {
                  LOCK();
                  *piVar10 = *piVar10 + 1;
                  UNLOCK();
                }
                if ((*(long *)this != 1) ||
                   (JsonLexer::Expect((JsonLexer *)this,lex,1,":"), *(long *)this != 1))
                goto LAB_002c5452;
                if (CONCAT44(local_118.status_.rep_._4_4_,local_118.status_.rep_._0_4_) != 1)
                goto LAB_002c5c8c;
                bVar14 = json_internal::operator==
                                   ((MaybeOwnedString *)&_Stack_110._M_first,(char (*) [6])"@type");
                if (bVar14) {
                  if (local_58 == true) {
                    JsonLocation::Invalid
                              ((JsonLocation *)this,&local_e0,0x15,"repeated @type in Any");
                  }
                  else {
                    JsonLexer::ParseUtf8
                              ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                *)local_1b0,lex);
                    *(undefined1 (*) [8])this = local_1b0;
                    if (((ulong)local_1b0 & 1) == 0) {
                      LOCK();
                      *(int *)local_1b0 = *(int *)local_1b0 + 1;
                      UNLOCK();
                    }
                    if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                         )local_1b0 ==
                        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                         )0x1) {
                      std::optional<google::protobuf::json_internal::MaybeOwnedString>::operator=
                                ((optional<google::protobuf::json_internal::MaybeOwnedString> *)
                                 local_88,(MaybeOwnedString *)auStack_1a8);
                      *(undefined8 *)this = 1;
                    }
                    absl::lts_20240722::internal_statusor::
                    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                     *)local_1b0);
                  }
                }
                else {
                  JsonLexer::SkipValue((JsonLexer *)this);
                }
                if (*(long *)this != 1) goto LAB_002c5452;
                literal_03._M_str = ",";
                literal_03._M_len = 1;
                bVar12 = JsonLexer::Peek(lex,literal_03);
                bVar14 = true;
              }
              else {
                if ((lex->options_).allow_legacy_syntax == true) {
                  JsonLexer::ParseBareWord
                            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                              *)local_1b0,lex);
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)&local_118.status_,
                              (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)local_1b0);
                  goto LAB_002c5304;
                }
                JsonLocation::Invalid((JsonLocation *)this,pJVar2,0xc,"expected \'\"\'");
LAB_002c5452:
                bVar14 = false;
              }
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)&local_118.status_);
              if (!bVar14) goto LAB_002c54c3;
              literal_04._M_str = "}";
              literal_04._M_len = 1;
              bVar14 = JsonLexer::Peek(lex,literal_04);
            } while (!bVar14);
            piVar10 = &(lex->options_).recursion_depth;
            *piVar10 = *piVar10 + 1;
            if (((lex->options_).allow_legacy_syntax == false) && (bVar12 != false)) {
              local_120 = "expected \'}\'";
LAB_002c54ab:
              JsonLocation::Invalid((JsonLocation *)this,pJVar2,0xc,local_120);
              goto LAB_002c54c3;
            }
          }
          *(undefined8 *)this = 1;
        }
      }
LAB_002c54c3:
      if (*(long *)this == 1) {
        sVar6 = *(size_t *)(local_b8._8_8_ + 0x38);
        auStack_1a8._36_4_ = SUB84(local_b8._8_8_,4);
        if ((ZeroCopyBufferedStream *)local_b8._8_8_ != (ZeroCopyBufferedStream *)0x0) {
          iVar24 = *(int *)(local_b8._8_8_ + 0x4c);
          uVar1 = iVar24 + 1;
          pcVar22 = (char *)(ulong)uVar1;
          *(uint *)(local_b8._8_8_ + 0x4c) = uVar1;
          if (iVar24 == 0) {
            *(size_t *)(local_b8._8_8_ + 0x40) = sVar6;
          }
          *(int *)(local_b8._8_8_ + 0x4c) = iVar24 + 2;
          if (uVar1 == 0) {
            *(size_t *)(local_b8._8_8_ + 0x40) = sVar6;
          }
        }
        auStack_1a8._8_8_ = (char *)(sVar6 - local_b8._0_8_);
        auStack_1a8._0_8_ = local_b8._0_8_;
        auStack_1a8._32_4_ = (undefined4)local_b8._8_8_;
        auStack_1a8[0x18] = 1;
        if ((ZeroCopyBufferedStream *)local_b8._8_8_ != (ZeroCopyBufferedStream *)0x0) {
          ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_b8._8_8_);
        }
        sVar28 = MaybeOwnedString::AsView((MaybeOwnedString *)local_1b0);
        if ((ZeroCopyBufferedStream *)CONCAT44(auStack_1a8._36_4_,auStack_1a8._32_4_) !=
            (ZeroCopyBufferedStream *)0x0) {
          ZeroCopyBufferedStream::DownRefBuffer
                    ((ZeroCopyBufferedStream *)CONCAT44(auStack_1a8._36_4_,auStack_1a8._32_4_));
          auStack_1a8[0x20] = '\0';
          auStack_1a8[0x21] = '\0';
          auStack_1a8[0x22] = '\0';
          auStack_1a8[0x23] = '\0';
          auStack_1a8[0x24] = '\0';
          auStack_1a8[0x25] = '\0';
          auStack_1a8[0x26] = '\0';
          auStack_1a8[0x27] = '\0';
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>_&>
          ::_S_vtable._M_arr[(byte)auStack_1a8[0x18]]._M_data)
                  ((anon_class_1_0_00000001 *)&local_118.status_,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                    *)local_1b0);
        io::ArrayInputStream::ArrayInputStream
                  ((ArrayInputStream *)&local_118.status_,sVar28._M_str,(int)sVar28._M_len,-1);
        pMStack_138 = lex->path_;
        local_150.heap.control = (ctrl_t *)CONCAT44(local_b8._20_4_,local_b8._16_4_);
        local_150._12_4_ = local_b8._28_4_;
        local_150._8_4_ = local_b8._24_4_;
        local_140 = local_b8._32_4_;
        uStack_13c = local_b8._36_4_;
        auStack_1a8._68_4_ = 0;
        auStack_1a8._0_16_ = ZEXT816(0);
        auStack_1a8._16_8_ = (pointer)0x0;
        auStack_1a8[0x18] = '\0';
        auStack_1a8[0x19] = '\0';
        auStack_1a8[0x1a] = '\0';
        auStack_1a8[0x1b] = '\0';
        auStack_1a8[0x1c] = '\0';
        auStack_1a8[0x1d] = '\0';
        auStack_1a8[0x1e] = '\0';
        auStack_1a8[0x1f] = '\0';
        auStack_1a8[0x20] = '\0';
        auStack_1a8[0x21] = '\0';
        auStack_1a8[0x22] = '\0';
        auStack_1a8[0x23] = '\0';
        auStack_1a8[0x24] = '\0';
        auStack_1a8[0x25] = '\0';
        auStack_1a8[0x26] = '\0';
        auStack_1a8[0x27] = '\0';
        auStack_1a8[0x28] = false;
        auStack_1a8._48_8_ = 0;
        auStack_1a8._56_8_ = (uint8_t *)0x0;
        auStack_1a8[0x40] = false;
        auStack_1a8._72_8_ = *(undefined8 *)&lex->options_;
        auStack_1a8[0x50] = (lex->options_).allow_legacy_syntax;
        auStack_1a8._81_3_ = *(undefined3 *)&(lex->options_).field_0x9;
        local_1b0 = (undefined1  [8])&local_118;
        local_130.heap.control = (ctrl_t *)pMStack_138;
        if (local_58 == false) {
          if ((lex->options_).allow_legacy_syntax == false) {
            JsonLocation::Invalid((JsonLocation *)this,local_b8 + 0x10,0x14,"missing @type in Any");
          }
          else {
            if ((lex->options_).allow_legacy_syntax == false) goto LAB_002c5c99;
            JsonLexer::
            VisitObject<google::protobuf::json_internal::(anonymous_namespace)::ParseAny<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(auto:1&)_1_>
                      ((JsonLexer *)this,
                       (LocationWith<google::protobuf::json_internal::Mark> *)local_1b0);
            if (*(long *)this == 1) {
              absl::lts_20240722::Status::~Status((Status *)this);
              *(undefined8 *)this = 1;
            }
          }
        }
        else {
          pFVar19 = Proto3Type::MustHaveField(desc,1);
          sVar28 = MaybeOwnedString::AsView((MaybeOwnedString *)local_88);
          x._M_str = pcVar22;
          x._M_len = (size_t)sVar28._M_str;
          ParseProto3Type::SetString((ParseProto3Type *)pFVar19,(Field)msg,(Msg *)sVar28._M_len,x);
          pFVar19 = Proto3Type::MustHaveField(desc,2);
          psVar17 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)local_88);
          ParseProto3Type::
          NewDynamic<google::protobuf::json_internal::(anonymous_namespace)::ParseAny<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(google::protobuf::json_internal::ResolverPool::Message_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)_1_>
                    ((ParseProto3Type *)this,pFVar19,psVar17,msg,(JsonLexer *)local_1b0);
        }
        if ((pointer)auStack_1a8._16_8_ != (pointer)0x0) {
          operator_delete((void *)auStack_1a8._16_8_,
                          CONCAT44(auStack_1a8._36_4_,auStack_1a8._32_4_) - auStack_1a8._16_8_);
        }
      }
      if (local_58 == true) {
        std::_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString> *)
                   local_88);
      }
      if ((ZeroCopyBufferedStream *)local_b8._8_8_ == (ZeroCopyBufferedStream *)0x0) {
        return (Status)(uintptr_t)this;
      }
      ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_b8._8_8_);
      return (Status)(uintptr_t)this;
    }
    JsonLexer::PeekKind((JsonLexer *)local_1b0);
    auVar11 = local_1b0;
    uVar3 = auStack_1a8._0_4_;
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)local_1b0);
    if ((((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )auVar11 !=
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) || (uVar3 != 0)) || ((lex->options_).allow_legacy_syntax == false)) {
      switch(MVar15) {
      case kWrapper:
        pMVar18 = (Msg<google::protobuf::json_internal::ParseProto3Type> *)
                  Proto3Type::MustHaveField(desc,1);
        ParseSingular<google::protobuf::json_internal::ParseProto3Type>
                  ((JsonLexer *)this,(Field<google::protobuf::json_internal::ParseProto3Type>)lex,
                   pMVar18);
        return (Status)(uintptr_t)this;
      case kList:
        ParseListValue<google::protobuf::json_internal::ParseProto3Type>(this,lex,desc,msg);
        return (Status)(uintptr_t)this;
      case kTimestamp:
        ParseTimestamp<google::protobuf::json_internal::ParseProto3Type>
                  ((JsonLexer *)this,(Desc<google::protobuf::json_internal::ParseProto3Type> *)lex,
                   (Msg<google::protobuf::json_internal::ParseProto3Type> *)desc);
        return (Status)(uintptr_t)this;
      case kDuration:
        ParseDuration<google::protobuf::json_internal::ParseProto3Type>(this,lex,desc,msg);
        return (Status)(uintptr_t)this;
      case kFieldMask:
        ParseFieldMask<google::protobuf::json_internal::ParseProto3Type>
                  ((JsonLexer *)this,(Desc<google::protobuf::json_internal::ParseProto3Type> *)lex,
                   (Msg<google::protobuf::json_internal::ParseProto3Type> *)desc);
        return (Status)(uintptr_t)this;
      }
    }
    goto switchD_002c4be7_caseD_3;
  }
  SVar27 = JsonLexer::PeekKind((JsonLexer *)&local_118.status_);
  uVar21 = SVar27.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>._8_8_;
  piVar10 = (int *)CONCAT44(local_118.status_.rep_._4_4_,local_118.status_.rep_._0_4_);
  *(int **)this = piVar10;
  if ((local_118.status_.rep_._0_4_ & 1) == 0) {
    LOCK();
    *piVar10 = *piVar10 + 1;
    UNLOCK();
  }
  if (*(long *)this != 1) goto LAB_002c5c46;
  if (CONCAT44(local_118.status_.rep_._4_4_,local_118.status_.rep_._0_4_) != 1) {
LAB_002c5c72:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_118.status_);
LAB_002c5c7f:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_118.status_);
LAB_002c5c8c:
    absl::lts_20240722::internal_statusor::Helper::Crash(&local_118.status_);
LAB_002c5c99:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/json/internal/parser.cc"
               ,0x3f7,0x21,"lex.options().allow_legacy_syntax");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  switch(_Stack_110._0_4_) {
  case 0:
    pMVar20 = (Msg *)Proto3Type::MustHaveField(desc,5,uVar21);
    pMVar26 = lex->path_;
    puVar8 = (pMVar20->stream_).impl_.buffer_end_;
    puVar23 = (undefined8 *)(*(ulong *)(puVar8 + 0x28) & 0xfffffffffffffffc);
    pcVar22 = (char *)*puVar23;
    pcVar9 = (pointer)puVar23[1];
    uVar3 = *(undefined4 *)(puVar8 + 0x48);
    auStack_1a8._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName((Field)pMVar20);
    local_1b0._0_4_ = uVar3;
    auStack_1a8[0x18] = SUB81(pcVar22,0);
    auStack_1a8._25_7_ = (undefined7)((ulong)pcVar22 >> 8);
    auStack_1a8[0x20] = 0xff;
    auStack_1a8[0x21] = 0xff;
    auStack_1a8[0x22] = 0xff;
    auStack_1a8[0x23] = 0xff;
    iVar5._M_current =
         (pMVar26->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a8._16_8_ = pcVar9;
    if (iVar5._M_current ==
        (pMVar26->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar26->components_,iVar5,(Component *)local_1b0);
    }
    else {
      ((iVar5._M_current)->field_name)._M_str = pcVar22;
      *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(auStack_1a8._36_4_,0xffffffff);
      ((iVar5._M_current)->type_name)._M_str = (char *)auStack_1a8._8_8_;
      ((iVar5._M_current)->field_name)._M_len = (size_t)pcVar9;
      *(undefined1 (*) [8])iVar5._M_current = local_1b0;
      ((iVar5._M_current)->type_name)._M_len = auStack_1a8._0_8_;
      ppCVar25 = &(pMVar26->components_).
                  super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar25 = *ppCVar25 + 1;
    }
    ParseProto3Type::
    NewMsg<google::protobuf::json_internal::(anonymous_namespace)::ParseValue<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(auto:1&,auto:2&)_1_>
              ((Field)this,pMVar20,(anon_class_8_1_ba1d5d7f)msg);
    goto LAB_002c5be9;
  case 1:
    pMVar20 = (Msg *)Proto3Type::MustHaveField(desc,6,uVar21);
    pMVar26 = lex->path_;
    puVar8 = (pMVar20->stream_).impl_.buffer_end_;
    puVar23 = (undefined8 *)(*(ulong *)(puVar8 + 0x28) & 0xfffffffffffffffc);
    pcVar22 = (char *)*puVar23;
    pcVar9 = (pointer)puVar23[1];
    uVar3 = *(undefined4 *)(puVar8 + 0x48);
    auStack_1a8._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName((Field)pMVar20);
    local_1b0._0_4_ = uVar3;
    auStack_1a8[0x18] = SUB81(pcVar22,0);
    auStack_1a8._25_7_ = (undefined7)((ulong)pcVar22 >> 8);
    auStack_1a8[0x20] = 0xff;
    auStack_1a8[0x21] = 0xff;
    auStack_1a8[0x22] = 0xff;
    auStack_1a8[0x23] = 0xff;
    iVar5._M_current =
         (pMVar26->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a8._16_8_ = pcVar9;
    if (iVar5._M_current ==
        (pMVar26->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar26->components_,iVar5,(Component *)local_1b0);
    }
    else {
      ((iVar5._M_current)->field_name)._M_str = pcVar22;
      *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(auStack_1a8._36_4_,0xffffffff);
      ((iVar5._M_current)->type_name)._M_str = (char *)auStack_1a8._8_8_;
      ((iVar5._M_current)->field_name)._M_len = (size_t)pcVar9;
      *(undefined1 (*) [8])iVar5._M_current = local_1b0;
      ((iVar5._M_current)->type_name)._M_len = auStack_1a8._0_8_;
      ppCVar25 = &(pMVar26->components_).
                  super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar25 = *ppCVar25 + 1;
    }
    ParseProto3Type::
    NewMsg<google::protobuf::json_internal::(anonymous_namespace)::ParseValue<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(auto:1&,auto:2&)_2_>
              ((Field)this,pMVar20,(anon_class_8_1_ba1d5d7f)msg);
LAB_002c5be9:
    ppCVar25 = &(pMVar26->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar25 = *ppCVar25 + -1;
    goto LAB_002c5c46;
  case 2:
    pFVar19 = Proto3Type::MustHaveField(desc,3,uVar21);
    pMVar26 = lex->path_;
    puVar23 = (undefined8 *)
              ((ulong)(pFVar19->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar7 = (char *)*puVar23;
    pcVar9 = (pointer)puVar23[1];
    iVar24 = (pFVar19->raw_->field_0)._impl_.kind_;
    auStack_1a8._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar19);
    local_1b0._0_4_ = iVar24;
    auStack_1a8[0x18] = SUB81(pcVar7,0);
    auStack_1a8._25_7_ = (undefined7)((ulong)pcVar7 >> 8);
    auStack_1a8[0x20] = 0xff;
    auStack_1a8[0x21] = 0xff;
    auStack_1a8[0x22] = 0xff;
    auStack_1a8[0x23] = 0xff;
    ppCVar25 = &(pMVar26->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar5._M_current =
         (pMVar26->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a8._16_8_ = pcVar9;
    if (iVar5._M_current ==
        (pMVar26->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar26->components_,iVar5,(Component *)local_1b0);
    }
    else {
      ((iVar5._M_current)->field_name)._M_str = pcVar7;
      *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(auStack_1a8._36_4_,0xffffffff);
      ((iVar5._M_current)->type_name)._M_str = (char *)auStack_1a8._8_8_;
      ((iVar5._M_current)->field_name)._M_len = (size_t)pcVar9;
      *(undefined1 (*) [8])iVar5._M_current = local_1b0;
      ((iVar5._M_current)->type_name)._M_len = auStack_1a8._0_8_;
      *ppCVar25 = *ppCVar25 + 1;
    }
    JsonLexer::ParseUtf8
              ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)local_1b0,lex);
    *(undefined1 (*) [8])this = local_1b0;
    if (((ulong)local_1b0 & 1) == 0) {
      LOCK();
      *(int *)local_1b0 = *(int *)local_1b0 + 1;
      UNLOCK();
    }
    if (*(long *)this != 1) {
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)local_1b0);
LAB_002c5c41:
      *ppCVar25 = *ppCVar25 + -1;
      goto LAB_002c5c46;
    }
    absl::lts_20240722::Status::~Status((Status *)this);
    if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )local_1b0 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_1b0);
LAB_002c5cd5:
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_1b0);
      uVar21 = absl::lts_20240722::internal_statusor::Helper::Crash((Status *)local_1b0);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)local_1b0);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_118.status_);
      if (local_58 == true) {
        std::_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString> *)
                   local_88);
      }
      LocationWith<google::protobuf::json_internal::Mark>::~LocationWith
                ((LocationWith<google::protobuf::json_internal::Mark> *)local_b8);
      _Unwind_Resume(uVar21);
    }
    psVar17 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)auStack_1a8);
    x_00._M_str = pcVar22;
    x_00._M_len = (size_t)(psVar17->_M_dataplus)._M_p;
    ParseProto3Type::SetString
              ((ParseProto3Type *)pFVar19,(Field)msg,(Msg *)psVar17->_M_string_length,x_00);
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)local_1b0);
    break;
  case 3:
    pFVar19 = Proto3Type::MustHaveField(desc,2,uVar21);
    pMVar26 = lex->path_;
    puVar23 = (undefined8 *)
              ((ulong)(pFVar19->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar22 = (char *)*puVar23;
    pcVar9 = (pointer)puVar23[1];
    iVar24 = (pFVar19->raw_->field_0)._impl_.kind_;
    auStack_1a8._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar19);
    local_1b0._0_4_ = iVar24;
    auStack_1a8[0x18] = SUB81(pcVar22,0);
    auStack_1a8._25_7_ = (undefined7)((ulong)pcVar22 >> 8);
    auStack_1a8[0x20] = 0xff;
    auStack_1a8[0x21] = 0xff;
    auStack_1a8[0x22] = 0xff;
    auStack_1a8[0x23] = 0xff;
    ppCVar25 = &(pMVar26->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar5._M_current =
         (pMVar26->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a8._16_8_ = pcVar9;
    if (iVar5._M_current ==
        (pMVar26->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar26->components_,iVar5,(Component *)local_1b0);
    }
    else {
      ((iVar5._M_current)->field_name)._M_str = pcVar22;
      *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(auStack_1a8._36_4_,0xffffffff);
      ((iVar5._M_current)->type_name)._M_str = (char *)auStack_1a8._8_8_;
      ((iVar5._M_current)->field_name)._M_len = (size_t)pcVar9;
      *(undefined1 (*) [8])iVar5._M_current = local_1b0;
      ((iVar5._M_current)->type_name)._M_len = auStack_1a8._0_8_;
      *ppCVar25 = *ppCVar25 + 1;
    }
    JsonLexer::ParseNumber
              ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)local_1b0,lex);
    *(undefined1 (*) [8])this = local_1b0;
    if (((ulong)local_1b0 & 1) == 0) {
      LOCK();
      *(int *)local_1b0 = *(int *)local_1b0 + 1;
      UNLOCK();
    }
    if (*(long *)this != 1) {
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::~StatusOrData
                ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)local_1b0);
      goto LAB_002c5c41;
    }
    absl::lts_20240722::Status::~Status((Status *)this);
    if ((anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )local_1b0 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) goto LAB_002c5cd5;
    ParseProto3Type::SetDouble(pFVar19,msg,(double)auStack_1a8._0_8_);
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::~StatusOrData
              ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)local_1b0);
    break;
  case 4:
  case 5:
    pFVar19 = Proto3Type::MustHaveField(desc,4,uVar21);
    pMVar26 = lex->path_;
    puVar23 = (undefined8 *)
              ((ulong)(pFVar19->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar22 = (char *)*puVar23;
    pcVar9 = (pointer)puVar23[1];
    TVar4 = (pFVar19->raw_->field_0)._impl_.kind_;
    auStack_1a8._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar19);
    local_1b0._0_4_ = TVar4;
    auStack_1a8[0x18] = SUB81(pcVar22,0);
    auStack_1a8._25_7_ = (undefined7)((ulong)pcVar22 >> 8);
    auStack_1a8[0x20] = 0xff;
    auStack_1a8[0x21] = 0xff;
    auStack_1a8[0x22] = 0xff;
    auStack_1a8[0x23] = 0xff;
    ppCVar25 = &(pMVar26->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar5._M_current =
         (pMVar26->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a8._16_8_ = pcVar9;
    if (iVar5._M_current ==
        (pMVar26->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar26->components_,iVar5,(Component *)local_1b0);
    }
    else {
      ((iVar5._M_current)->field_name)._M_str = pcVar22;
      *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(auStack_1a8._36_4_,0xffffffff);
      ((iVar5._M_current)->type_name)._M_str = (char *)auStack_1a8._8_8_;
      ((iVar5._M_current)->field_name)._M_len = (size_t)pcVar9;
      (iVar5._M_current)->type = TVar4;
      *(undefined4 *)&(iVar5._M_current)->field_0x4 = local_1b0._4_4_;
      *(undefined4 *)&((iVar5._M_current)->type_name)._M_len = auStack_1a8._0_4_;
      *(undefined4 *)((long)&((iVar5._M_current)->type_name)._M_len + 4) = auStack_1a8._4_4_;
      *ppCVar25 = *ppCVar25 + 1;
    }
    if (CONCAT44(local_118.status_.rep_._4_4_,local_118.status_.rep_._0_4_) != 1) goto LAB_002c5c7f;
    if (_Stack_110._0_4_ == 4) {
      JsonLexer::Expect((JsonLexer *)this,lex,4,"true");
    }
    else {
      JsonLexer::Expect((JsonLexer *)this,lex,5,"false");
    }
    if (*(long *)this != 1) goto LAB_002c5c41;
    absl::lts_20240722::Status::~Status((Status *)this);
    ParseProto3Type::SetBool(pFVar19,msg,_Stack_110._0_4_ == 4);
    break;
  case 6:
    pFVar19 = Proto3Type::MustHaveField(desc,1,uVar21);
    pMVar26 = lex->path_;
    puVar23 = (undefined8 *)
              ((ulong)(pFVar19->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar22 = (char *)*puVar23;
    pcVar9 = (pointer)puVar23[1];
    TVar4 = (pFVar19->raw_->field_0)._impl_.kind_;
    auStack_1a8._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar19);
    local_1b0._0_4_ = TVar4;
    auStack_1a8[0x18] = SUB81(pcVar22,0);
    auStack_1a8._25_7_ = (undefined7)((ulong)pcVar22 >> 8);
    auStack_1a8[0x20] = 0xff;
    auStack_1a8[0x21] = 0xff;
    auStack_1a8[0x22] = 0xff;
    auStack_1a8[0x23] = 0xff;
    ppCVar25 = &(pMVar26->components_).
                super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    iVar5._M_current =
         (pMVar26->components_).
         super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_1a8._16_8_ = pcVar9;
    if (iVar5._M_current ==
        (pMVar26->components_).
        super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
                (&pMVar26->components_,iVar5,(Component *)local_1b0);
    }
    else {
      ((iVar5._M_current)->field_name)._M_str = pcVar22;
      *(ulong *)&(iVar5._M_current)->repeated_index = CONCAT44(auStack_1a8._36_4_,0xffffffff);
      ((iVar5._M_current)->type_name)._M_str = (char *)auStack_1a8._8_8_;
      ((iVar5._M_current)->field_name)._M_len = (size_t)pcVar9;
      (iVar5._M_current)->type = TVar4;
      *(undefined4 *)&(iVar5._M_current)->field_0x4 = local_1b0._4_4_;
      *(undefined4 *)&((iVar5._M_current)->type_name)._M_len = auStack_1a8._0_4_;
      *(undefined4 *)((long)&((iVar5._M_current)->type_name)._M_len + 4) = auStack_1a8._4_4_;
      *ppCVar25 = *ppCVar25 + 1;
    }
    JsonLexer::Expect((JsonLexer *)this,lex,4,"null");
    if (*(long *)this != 1) goto LAB_002c5c41;
    absl::lts_20240722::Status::~Status((Status *)this);
    ParseProto3Type::SetEnum(pFVar19,msg,0);
    break;
  default:
    goto switchD_002c4af6_default;
  }
  *ppCVar25 = *ppCVar25 + -1;
switchD_002c4af6_default:
  *(undefined8 *)this = 1;
LAB_002c5c46:
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_118.status_);
  return (Status)(uintptr_t)this;
code_r0x002c5197:
  piVar10 = &(lex->options_).recursion_depth;
  *piVar10 = *piVar10 + 1;
  if (((lex->options_).allow_legacy_syntax == false) && (local_1c9 != false)) {
    pcVar22 = "expected \'}\'";
LAB_002c51c1:
    JsonLocation::Invalid((JsonLocation *)this,local_130.heap.slot_array.p,0xc,pcVar22);
    return (Status)(uintptr_t)this;
  }
  goto LAB_002c4c4e;
}

Assistant:

absl::Status ParseMessage(JsonLexer& lex, const Desc<Traits>& desc,
                          Msg<Traits>& msg, bool any_reparse) {
  MessageType type = ClassifyMessage(Traits::TypeName(desc));
  if (!any_reparse) {
    switch (type) {
      case MessageType::kAny:
        return ParseAny<Traits>(lex, desc, msg);
      case MessageType::kValue:
        return ParseValue<Traits>(lex, desc, msg);
      case MessageType::kStruct:
        return ParseStructValue<Traits>(lex, desc, msg);
      default:
        break;
    }
    // For some types, the ESF parser permits parsing the "non-special" version.
    // It is not clear if this counts as out-of-spec, but we're treating it as
    // such.
    bool is_upcoming_object = lex.Peek(JsonLexer::kObj);
    if (!(is_upcoming_object && lex.options().allow_legacy_syntax)) {
      switch (type) {
        case MessageType::kList:
          return ParseListValue<Traits>(lex, desc, msg);
        case MessageType::kWrapper: {
          return ParseSingular<Traits>(lex, Traits::MustHaveField(desc, 1),
                                       msg);
        }
        case MessageType::kTimestamp:
          return ParseTimestamp<Traits>(lex, desc, msg);
        case MessageType::kDuration:
          return ParseDuration<Traits>(lex, desc, msg);
        case MessageType::kFieldMask:
          return ParseFieldMask<Traits>(lex, desc, msg);
        default:
          break;
      }
    }
  }

  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& name) -> absl::Status {
        // If this is a well-known type, we expect its contents to be inside
        // of a JSON field named "value".
        if (any_reparse) {
          if (name.value == "@type") {
            RETURN_IF_ERROR(lex.SkipValue());
            return absl::OkStatus();
          }
          if (type != MessageType::kNotWellKnown) {
            if (name.value != "value") {
              return lex.Invalid(
                  "fields in a well-known-typed Any must be @type or value");
            }
            // Parse the upcoming value as the message itself. This is *not*
            // an Any reparse because we do not expect to see @type in the
            // upcoming value.
            return ParseMessage<Traits>(lex, desc, msg,
                                        /*any_reparse=*/false);
          }
        }

        return ParseField<Traits>(lex, desc, name.value.ToString(), msg);
      });
}